

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int calc_image_size(file *file)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte local_a8;
  byte local_9c;
  byte local_60;
  byte local_54;
  png_uint_16 local_3e [3];
  png_uint_16 local_38;
  udigit row_bytes_1 [3];
  udigit row_width_1 [2];
  int digits_1;
  int digits;
  png_uint_32 pw;
  png_uint_16 local_20;
  udigit row_bytes [3];
  udigit row_width [2];
  int image_digits;
  int pass;
  png_uint_16 pd;
  file *file_local;
  
  image_digits._2_2_ = (png_uint_16)file->bit_depth;
  switch(file->color_type) {
  case '\0':
    if (((image_digits._2_2_ == 1) || (image_digits._2_2_ == 2)) ||
       ((image_digits._2_2_ == 4 || ((image_digits._2_2_ == 8 || (image_digits._2_2_ == 0x10)))))) {
LAB_00105db3:
      if ((file->width == 0) || (0x7fffffff < file->width)) {
        stop_invalid(file,"IHDR: width");
      }
      if ((file->height == 0) || (0x7fffffff < file->height)) {
        stop_invalid(file,"IHDR: height");
      }
      if (file->compression_method != '\0') {
        stop_invalid(file,"IHDR: compression method");
      }
      if (file->filter_method != '\0') {
        stop_invalid(file,"IHDR: filter method");
      }
      if (file->interlace_method == '\0') {
        iVar2 = uarb_set(local_3e,7);
        iVar3 = uarb_set(&local_38,(ulong)file->width);
        row_bytes_1._2_4_ = uarb_mult_digit(local_3e,iVar2,&local_38,iVar3,image_digits._2_2_);
        row_bytes_1._2_4_ = uarb_shift(local_3e,row_bytes_1._2_4_,3);
        row_bytes_1._2_4_ = uarb_inc(local_3e,row_bytes_1._2_4_,1);
        iVar2 = uarb_mult32(file->image_bytes,0,local_3e,row_bytes_1._2_4_,file->height);
        file->image_digits = iVar2;
      }
      else {
        if (file->interlace_method != '\x01') {
          stop_invalid(file,"IHDR: interlace method");
        }
        row_bytes[1] = 0;
        row_bytes[2] = 0;
        row_width[0] = 0;
        row_width[1] = 0;
        for (; (int)row_width < 7; row_width = (udigit  [2])((int)row_width + 1)) {
          if ((int)row_width < 2) {
            local_54 = 3;
          }
          else {
            local_54 = (byte)(7 - (int)row_width >> 1);
          }
          if ((int)row_width < 2) {
            local_60 = 3;
          }
          else {
            local_60 = (byte)(7 - (int)row_width >> 1);
          }
          uVar1 = file->width +
                  (((1 << (local_54 & 0x1f)) + -1) -
                  (((uint)row_width & 1) << (3U - (char)((int)row_width + 1 >> 1) & 0x1f) & 7)) >>
                  (local_60 & 0x1f);
          if (uVar1 != 0) {
            iVar2 = uarb_set((uarb)((long)&digits + 2),7);
            iVar3 = uarb_set(&local_20,(ulong)uVar1);
            iVar2 = uarb_mult_digit((uarb)((long)&digits + 2),iVar2,&local_20,iVar3,
                                    image_digits._2_2_);
            iVar2 = uarb_shift((uarb)((long)&digits + 2),iVar2,3);
            iVar2 = uarb_inc((uarb)((long)&digits + 2),iVar2,1);
            if ((int)row_width < 3) {
              local_9c = 3;
            }
            else {
              local_9c = (byte)(8 - (int)row_width >> 1);
            }
            if ((int)row_width < 3) {
              local_a8 = 3;
            }
            else {
              local_a8 = (byte)(8 - (int)row_width >> 1);
            }
            row_bytes._2_4_ =
                 uarb_mult32(file->image_bytes,row_bytes._2_4_,(uarb)((long)&digits + 2),iVar2,
                             file->height +
                             (((1 << (local_9c & 0x1f)) + -1) -
                             ((((uint)row_width ^ 0xffffffff) & 1) <<
                              (3U - (char)((int)row_width >> 1) & 0x1f) & 7)) >> (local_a8 & 0x1f));
          }
        }
        file->image_digits = row_bytes._2_4_;
      }
      if ((0 < file->image_digits) && (file->image_digits < 6)) {
        return 1;
      }
      __assert_fail("file->image_digits >= 1 && file->image_digits <= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0x5f0,"int calc_image_size(struct file *)");
    }
    break;
  default:
    stop_invalid(file,"IHDR: colour type");
  case '\x02':
    if ((image_digits._2_2_ == 8) || (image_digits._2_2_ == 0x10)) {
      image_digits._2_2_ = image_digits._2_2_ * 3;
      goto LAB_00105db3;
    }
    break;
  case '\x03':
    if ((((image_digits._2_2_ == 1) || (image_digits._2_2_ == 2)) || (image_digits._2_2_ == 4)) ||
       (image_digits._2_2_ == 8)) goto LAB_00105db3;
    break;
  case '\x04':
    if ((image_digits._2_2_ == 8) || (image_digits._2_2_ == 0x10)) {
      image_digits._2_2_ = image_digits._2_2_ << 1;
      goto LAB_00105db3;
    }
    break;
  case '\x06':
    if ((image_digits._2_2_ == 8) || (image_digits._2_2_ == 0x10)) {
      image_digits._2_2_ = image_digits._2_2_ << 2;
      goto LAB_00105db3;
    }
  }
  stop_invalid(file,"IHDR: bit depth");
}

Assistant:

static int
calc_image_size(struct file *file)
   /* Fill in the image_bytes field given the IHDR information, calls stop on
    * error.
    */
{
   png_uint_16 pd = file->bit_depth;

   switch (file->color_type)
   {
      default:
         stop_invalid(file, "IHDR: colour type");

      invalid_bit_depth:
         stop_invalid(file, "IHDR: bit depth");

      case 0: /* g */
         if (pd != 1 && pd != 2 && pd != 4 && pd != 8 && pd != 16)
            goto invalid_bit_depth;
         break;

      case 3:
         if (pd != 1 && pd != 2 && pd != 4 && pd != 8)
            goto invalid_bit_depth;
         break;

      case 2: /* rgb */
         if (pd != 8 && pd != 16)
            goto invalid_bit_depth;

         pd = (png_uint_16)(pd * 3);
         break;

      case 4: /* ga */
         if (pd != 8 && pd != 16)
            goto invalid_bit_depth;

         pd = (png_uint_16)(pd * 2);
         break;

      case 6: /* rgba */
         if (pd != 8 && pd != 16)
            goto invalid_bit_depth;

         pd = (png_uint_16)(pd * 4);
         break;
   }

   if (file->width < 1 || file->width > 0x7fffffff)
      stop_invalid(file, "IHDR: width");

   else if (file->height < 1 || file->height > 0x7fffffff)
      stop_invalid(file, "IHDR: height");

   else if (file->compression_method != 0)
      stop_invalid(file, "IHDR: compression method");

   else if (file->filter_method != 0)
      stop_invalid(file, "IHDR: filter method");

   else switch (file->interlace_method)
   {
      case PNG_INTERLACE_ADAM7:
         /* Interlacing makes the image larger because of the replication of
          * both the filter byte and the padding to a byte boundary.
          */
         {
            int pass;
            int image_digits = 0;
            udigit row_width[2], row_bytes[3];

            for (pass=0; pass<=6; ++pass)
            {
               png_uint_32 pw = PNG_PASS_COLS(file->width, pass);

               if (pw > 0)
               {
                  int  digits;

                  /* calculate 1+((pw*pd+7)>>3) in row_bytes */
                  digits = uarb_mult_digit(row_bytes, uarb_set(row_bytes, 7),
                     row_width, uarb_set(row_width, pw), pd);
                  digits = uarb_shift(row_bytes, digits, 3);
                  digits = uarb_inc(row_bytes, digits, 1);

                  /* Add row_bytes * pass-height to the file image_bytes field
                   */
                  image_digits = uarb_mult32(file->image_bytes, image_digits,
                     row_bytes, digits,
                     PNG_PASS_ROWS(file->height, pass));
               }
            }

            file->image_digits = image_digits;
         }
         break;

      case PNG_INTERLACE_NONE:
         {
            int  digits;
            udigit row_width[2], row_bytes[3];

            /* As above, but use image_width in place of the pass width: */
            digits = uarb_mult_digit(row_bytes, uarb_set(row_bytes, 7),
               row_width, uarb_set(row_width, file->width), pd);
            digits = uarb_shift(row_bytes, digits, 3);
            digits = uarb_inc(row_bytes, digits, 1);

            /* Set row_bytes * image-height to the file image_bytes field */
            file->image_digits = uarb_mult32(file->image_bytes, 0,
               row_bytes, digits, file->height);
         }
         break;

      default:
         stop_invalid(file, "IHDR: interlace method");
   }

   assert(file->image_digits >= 1 && file->image_digits <= 5);
   return 1;
}